

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

example * VW::read_example(vw *all,char *example_line)

{
  uint64_t *puVar1;
  parser *ppVar2;
  example *ex;
  
  ppVar2 = all->p;
  ex = object_pool<example,_example_initializer>::get_object(&ppVar2->example_pool);
  ex->in_use = true;
  puVar1 = &ppVar2->begin_parsed_examples;
  *puVar1 = *puVar1 + 1;
  read_line(all,ex,example_line);
  setup_example(all,ex);
  puVar1 = &all->p->end_parsed_examples;
  *puVar1 = *puVar1 + 1;
  return ex;
}

Assistant:

example* read_example(vw& all, char* example_line)
{
  example* ret = &get_unused_example(&all);

  VW::read_line(all, ret, example_line);
  setup_example(all, ret);
  all.p->end_parsed_examples++;

  return ret;
}